

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Opt::parse
          (InternalParseResult *__return_storage_ptr__,Opt *this,string *param_1,TokenStream *tokens
          )

{
  bool bVar1;
  uint uVar2;
  Token *pTVar3;
  element_type *peVar4;
  ParseResultType *pPVar5;
  TokenStream *remainingTokens_00;
  ParseState local_260;
  ParseState local_230;
  ParseState local_200;
  undefined1 local_1d0 [8];
  ParserResult result_1;
  Token local_180;
  Token *local_158;
  Token *argToken;
  element_type *local_130;
  BoundValueRefBase *valueRef;
  undefined1 local_f8 [8];
  ParserResult result;
  BoundFlagRefBase *flagRef;
  string sStack_b8;
  BoundFlagRefBase **local_98;
  Token *token;
  TokenStream remainingTokens;
  undefined1 local_58 [8];
  Result validationResult;
  TokenStream *tokens_local;
  string *param_1_local;
  Opt *this_local;
  
  validationResult.m_errorMessage.field_2._8_8_ = tokens;
  (*(this->super_ParserRefImpl<Catch::clara::detail::Opt>).
    super_ComposableParserImpl<Catch::clara::detail::Opt>.super_ParserBase._vptr_ParserBase[2])();
  bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_58);
  if (!bVar1) {
    BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
              (__return_storage_ptr__,(BasicResult<void> *)local_58);
    remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    goto LAB_0016cc27;
  }
  TokenStream::TokenStream
            ((TokenStream *)&token,(TokenStream *)validationResult.m_errorMessage.field_2._8_8_);
  bVar1 = TokenStream::operator_cast_to_bool((TokenStream *)&token);
  if ((bVar1) && (pTVar3 = TokenStream::operator->((TokenStream *)&token), pTVar3->type == Option))
  {
    TokenStream::operator*((Token *)&flagRef,(TokenStream *)&token);
    local_98 = &flagRef;
    bVar1 = isMatch(this,&sStack_b8);
    if (bVar1) {
      peVar4 = std::
               __shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref);
      uVar2 = (*peVar4->_vptr_BoundRef[3])();
      if ((uVar2 & 1) == 0) {
        local_130 = std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::
                    get(&(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
                         super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                       );
        TokenStream::operator++((TokenStream *)&token);
        bVar1 = TokenStream::operator_cast_to_bool((TokenStream *)&token);
        if (!bVar1) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &argToken,"Expected argument following ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_98 + 1));
          BasicResult<Catch::clara::detail::ParseState>::runtimeError
                    (__return_storage_ptr__,(string *)&argToken);
          ::std::__cxx11::string::~string((string *)&argToken);
          remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          goto LAB_0016cb88;
        }
        TokenStream::operator*(&local_180,(TokenStream *)&token);
        local_158 = &local_180;
        if (local_180.type == Argument) {
          (*local_130->_vptr_BoundRef[4])(local_1d0,local_130,&local_180.token);
          bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_1d0);
          if (bVar1) {
            pPVar5 = ResultValueBase<Catch::clara::detail::ParseResultType>::value
                               ((ResultValueBase<Catch::clara::detail::ParseResultType> *)local_1d0)
            ;
            if (*pPVar5 == ShortCircuitAll) {
              pPVar5 = ResultValueBase<Catch::clara::detail::ParseResultType>::value
                                 ((ResultValueBase<Catch::clara::detail::ParseResultType> *)
                                  local_1d0);
              ParseState::ParseState(&local_200,*pPVar5,(TokenStream *)&token);
              BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                        (__return_storage_ptr__,&local_200);
              ParseState::~ParseState(&local_200);
              remainingTokens.m_tokenBuffer.
              super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
            }
            else {
              remainingTokens.m_tokenBuffer.
              super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            }
          }
          else {
            BasicResult<Catch::clara::detail::ParseState>::
            BasicResult<Catch::clara::detail::ParseResultType>
                      (__return_storage_ptr__,
                       (BasicResult<Catch::clara::detail::ParseResultType> *)local_1d0);
            remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                    ((BasicResult<Catch::clara::detail::ParseResultType> *)local_1d0);
        }
        else {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&result_1.m_errorMessage.field_2 + 8),
                           "Expected argument following ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_98 + 1));
          BasicResult<Catch::clara::detail::ParseState>::runtimeError
                    (__return_storage_ptr__,(string *)((long)&result_1.m_errorMessage.field_2 + 8));
          ::std::__cxx11::string::~string
                    ((string *)(result_1.m_errorMessage.field_2._M_local_buf + 8));
          remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        Token::~Token(&local_180);
      }
      else {
        result.m_errorMessage.field_2._8_8_ =
             std::__shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(this->super_ParserRefImpl<Catch::clara::detail::Opt>).m_ref.
                         super___shared_ptr<Catch::clara::detail::BoundRef,_(__gnu_cxx::_Lock_policy)2>
                       );
        (*((element_type *)result.m_errorMessage.field_2._8_8_)->_vptr_BoundRef[4])
                  (local_f8,result.m_errorMessage.field_2._8_8_,1);
        bVar1 = BasicResult::operator_cast_to_bool((BasicResult *)local_f8);
        if (bVar1) {
          pPVar5 = ResultValueBase<Catch::clara::detail::ParseResultType>::value
                             ((ResultValueBase<Catch::clara::detail::ParseResultType> *)local_f8);
          if (*pPVar5 == ShortCircuitAll) {
            pPVar5 = ResultValueBase<Catch::clara::detail::ParseResultType>::value
                               ((ResultValueBase<Catch::clara::detail::ParseResultType> *)local_f8);
            ParseState::ParseState((ParseState *)&valueRef,*pPVar5,(TokenStream *)&token);
            BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                      (__return_storage_ptr__,(ParseState *)&valueRef);
            ParseState::~ParseState((ParseState *)&valueRef);
            remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          }
          else {
            remainingTokens.m_tokenBuffer.
            super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          }
        }
        else {
          BasicResult<Catch::clara::detail::ParseState>::
          BasicResult<Catch::clara::detail::ParseResultType>
                    (__return_storage_ptr__,
                     (BasicResult<Catch::clara::detail::ParseResultType> *)local_f8);
          remainingTokens.m_tokenBuffer.
          super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        }
        BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult
                  ((BasicResult<Catch::clara::detail::ParseResultType> *)local_f8);
      }
      if ((int)remainingTokens.m_tokenBuffer.
               super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) {
        remainingTokens_00 = TokenStream::operator++((TokenStream *)&token);
        ParseState::ParseState(&local_230,Matched,remainingTokens_00);
        BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
                  (__return_storage_ptr__,&local_230);
        ParseState::~ParseState(&local_230);
        remainingTokens.m_tokenBuffer.
        super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
    }
    else {
      remainingTokens.m_tokenBuffer.
      super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    }
LAB_0016cb88:
    Token::~Token((Token *)&flagRef);
    if ((int)remainingTokens.m_tokenBuffer.
             super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage == 0) goto LAB_0016cbad;
  }
  else {
LAB_0016cbad:
    ParseState::ParseState(&local_260,NoMatch,(TokenStream *)&token);
    BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
              (__return_storage_ptr__,&local_260);
    ParseState::~ParseState(&local_260);
    remainingTokens.m_tokenBuffer.
    super__Vector_base<Catch::clara::detail::Token,_std::allocator<Catch::clara::detail::Token>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  TokenStream::~TokenStream((TokenStream *)&token);
LAB_0016cc27:
  BasicResult<void>::~BasicResult((BasicResult<void> *)local_58);
  return __return_storage_ptr__;
}

Assistant:

auto parse( std::string const&, TokenStream const &tokens ) const -> InternalParseResult override {
            auto validationResult = validate();
            if( !validationResult )
                return InternalParseResult( validationResult );

            auto remainingTokens = tokens;
            if( remainingTokens && remainingTokens->type == TokenType::Option ) {
                auto const &token = *remainingTokens;
                if( isMatch(token.token ) ) {
                    if( m_ref->isFlag() ) {
                        auto flagRef = static_cast<detail::BoundFlagRefBase*>( m_ref.get() );
                        auto result = flagRef->setFlag( true );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    } else {
                        auto valueRef = static_cast<detail::BoundValueRefBase*>( m_ref.get() );
                        ++remainingTokens;
                        if( !remainingTokens )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto const &argToken = *remainingTokens;
                        if( argToken.type != TokenType::Argument )
                            return InternalParseResult::runtimeError( "Expected argument following " + token.token );
                        auto result = valueRef->setValue( argToken.token );
                        if( !result )
                            return InternalParseResult( result );
                        if( result.value() == ParseResultType::ShortCircuitAll )
                            return InternalParseResult::ok( ParseState( result.value(), remainingTokens ) );
                    }
                    return InternalParseResult::ok( ParseState( ParseResultType::Matched, ++remainingTokens ) );
                }
            }
            return InternalParseResult::ok( ParseState( ParseResultType::NoMatch, remainingTokens ) );
        }